

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small_shared.h
# Opt level: O2

Element_conflict
Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
::_multiply(Element_conflict a,Element_conflict b)

{
  Element_conflict EVar1;
  Characteristic CVar2;
  Element_conflict EVar3;
  
  EVar3 = a;
  if (a < b) {
    EVar3 = b;
  }
  if (b < a) {
    a = b;
  }
  EVar1 = 0;
  while( true ) {
    if (a == 0) break;
    if ((a & 1) != 0) {
      CVar2 = 0;
      if (productOfAllCharacteristics_ - EVar1 <= EVar3) {
        CVar2 = productOfAllCharacteristics_;
      }
      EVar1 = (EVar1 + EVar3) - CVar2;
    }
    CVar2 = 0;
    if (productOfAllCharacteristics_ - EVar3 <= EVar3) {
      CVar2 = productOfAllCharacteristics_;
    }
    a = a >> 1;
    EVar3 = EVar3 * 2 - CVar2;
  }
  return EVar1;
}

Assistant:

static Element _multiply(Element a, Element b) {
    Element res = 0;
    Element temp_b = 0;

    if (b < a) std::swap(a, b);

    while (a != 0) {
      if (a & 1) {
        /* Add b to res, modulo m, without overflow */
        if (b >= productOfAllCharacteristics_ - res) res -= productOfAllCharacteristics_;
        res += b;
      }
      a >>= 1;

      /* Double b, modulo m */
      temp_b = b;
      if (b >= productOfAllCharacteristics_ - b) temp_b -= productOfAllCharacteristics_;
      b += temp_b;
    }
    return res;
  }